

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PotentialEnergyObjectiveFunction.cpp
# Opt level: O0

void __thiscall
OpenMD::PotentialEnergyObjectiveFunction::gradient
          (PotentialEnergyObjectiveFunction *this,
          DynamicVector<double,_std::allocator<double>_> *grad,
          DynamicVector<double,_std::allocator<double>_> *x)

{
  Shake *in_RSI;
  long in_RDI;
  Shake *in_stack_00000060;
  DynamicVector<double,_std::allocator<double>_> *in_stack_00000088;
  PotentialEnergyObjectiveFunction *in_stack_00000090;
  FluctuatingChargeConstraints *in_stack_000000a0;
  DynamicVector<double,_std::allocator<double>_> *in_stack_000000d8;
  PotentialEnergyObjectiveFunction *in_stack_000000e0;
  
  setCoor(in_stack_00000090,in_stack_00000088);
  Shake::constraintR(in_RSI);
  (**(code **)(**(long **)(in_RDI + 0x10) + 0x10))();
  if ((*(byte *)(in_RDI + 0x30) & 1) != 0) {
    FluctuatingChargeConstraints::applyConstraints(in_stack_000000a0);
  }
  Shake::constraintF(in_stack_00000060);
  getGrad(in_stack_000000e0,in_stack_000000d8);
  return;
}

Assistant:

void PotentialEnergyObjectiveFunction::gradient(
      DynamicVector<RealType>& grad, const DynamicVector<RealType>& x) {
    setCoor(x);
    shake_->constraintR();
    forceMan_->calcForces();
    if (hasFlucQ_) fqConstraints_->applyConstraints();
    shake_->constraintF();
    getGrad(grad);
  }